

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O3

void aom_highbd_convolve8_horiz_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined2 uVar25;
  
  if (0 < h) {
    lVar14 = (long)src * 2 + -6;
    lVar10 = (long)dst * 2;
    iVar15 = 0;
    do {
      if (0 < w) {
        uVar8 = 0;
        uVar11 = (uint)((ulong)filter_x >> 4) & 0xf;
        do {
          iVar17 = 0;
          iVar18 = 0;
          iVar19 = 0;
          iVar20 = 0;
          lVar13 = 0;
          do {
            uVar1 = *(ulong *)(lVar14 + (long)((int)uVar11 >> 4) * 2 + lVar13 * 2);
            auVar3._8_4_ = 0;
            auVar3._0_8_ = uVar1;
            auVar3._12_2_ = (short)(uVar1 >> 0x30);
            auVar4._8_2_ = (short)(uVar1 >> 0x20);
            auVar4._0_8_ = uVar1;
            auVar4._10_4_ = auVar3._10_4_;
            auVar6._6_8_ = 0;
            auVar6._0_6_ = auVar4._8_6_;
            auVar5._4_2_ = (short)(uVar1 >> 0x10);
            auVar5._0_4_ = (uint)uVar1;
            auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
            uVar2 = *(ulong *)((ulong)((uVar11 & 0xf) << 4) + ((ulong)filter_x & 0xffffffffffffff00)
                              + lVar13 * 2);
            uVar25 = (undefined2)(uVar2 >> 0x30);
            auVar23._8_4_ = 0;
            auVar23._0_8_ = uVar2;
            auVar23._12_2_ = uVar25;
            auVar23._14_2_ = uVar25;
            uVar25 = (undefined2)(uVar2 >> 0x20);
            auVar22._12_4_ = auVar23._12_4_;
            auVar22._8_2_ = 0;
            auVar22._0_8_ = uVar2;
            auVar22._10_2_ = uVar25;
            auVar21._10_6_ = auVar22._10_6_;
            auVar21._8_2_ = uVar25;
            auVar21._0_8_ = uVar2;
            uVar25 = (undefined2)(uVar2 >> 0x10);
            auVar7._4_8_ = auVar21._8_8_;
            auVar7._2_2_ = uVar25;
            auVar7._0_2_ = uVar25;
            auVar24._0_4_ = (int)(short)uVar2;
            auVar24._4_4_ = auVar7._0_4_ >> 0x10;
            auVar24._8_4_ = auVar21._8_4_ >> 0x10;
            auVar24._12_4_ = auVar22._12_4_ >> 0x10;
            iVar17 = iVar17 + auVar24._0_4_ * ((uint)uVar1 & 0xffff);
            iVar18 = iVar18 + auVar5._4_4_ * auVar24._4_4_;
            iVar19 = iVar19 + (int)((auVar24._8_8_ & 0xffffffff) *
                                   ((ulong)auVar4._8_6_ & 0xffffffff));
            iVar20 = iVar20 + (auVar3._10_4_ >> 0x10) * auVar24._12_4_;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 8);
          uVar9 = iVar20 + iVar18 + iVar19 + iVar17 + 0x40 >> 7;
          if (bd == 10) {
            uVar12 = 0x3ff;
            bVar16 = uVar9 < 0x3ff;
          }
          else if (bd == 0xc) {
            bVar16 = uVar9 < 0xfff;
            uVar12 = 0xfff;
          }
          else {
            bVar16 = uVar9 < 0xff;
            uVar12 = 0xff;
          }
          if (bVar16) {
            uVar12 = uVar9;
          }
          uVar25 = (short)uVar12;
          if ((int)uVar9 < 0) {
            uVar25 = 0;
          }
          *(undefined2 *)(lVar10 + uVar8 * 2) = uVar25;
          uVar11 = uVar11 + x_step_q4;
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)w);
      }
      lVar10 = lVar10 + dst_stride * 2;
      iVar15 = iVar15 + 1;
      lVar14 = lVar14 + src_stride * 2;
    } while (iVar15 != h);
  }
  return;
}

Assistant:

void aom_highbd_convolve8_horiz_c(const uint8_t *src, ptrdiff_t src_stride,
                                  uint8_t *dst, ptrdiff_t dst_stride,
                                  const int16_t *filter_x, int x_step_q4,
                                  const int16_t *filter_y, int y_step_q4, int w,
                                  int h, int bd) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);
  (void)filter_y;
  (void)y_step_q4;

  highbd_convolve_horiz(src, src_stride, dst, dst_stride, filters_x, x0_q4,
                        x_step_q4, w, h, bd);
}